

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O3

DFrameBuffer * I_SetMode(int *width,int *height,DFrameBuffer *old)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  
  iVar1 = (*Video->_vptr_IVideo[2])();
  if (iVar1 == 2) {
    uVar2 = (uint)fullscreen.Value;
  }
  else if (iVar1 == 1) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
  }
  iVar1 = (*Video->_vptr_IVideo[4])
                    (Video,(ulong)(uint)*width,(ulong)(uint)*height,(ulong)uVar2,old,
                     Video->_vptr_IVideo[4]);
  return (DFrameBuffer *)CONCAT44(extraout_var,iVar1);
}

Assistant:

DFrameBuffer *I_SetMode (int &width, int &height, DFrameBuffer *old)
{
	bool fs = false;
	switch (Video->GetDisplayType ())
	{
	case DISPLAY_WindowOnly:
		fs = false;
		break;
	case DISPLAY_FullscreenOnly:
		fs = true;
		break;
	case DISPLAY_Both:
		fs = fullscreen;
		break;
	}
	DFrameBuffer *res = Video->CreateFrameBuffer (width, height, fs, old);

	/* Right now, CreateFrameBuffer cannot return NULL
	if (res == NULL)
	{
		I_FatalError ("Mode %dx%d is unavailable\n", width, height);
	}
	*/
	return res;
}